

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.c
# Opt level: O2

uint64_t sx_tm_since(uint64_t start_ticks)

{
  uint64_t uVar1;
  uint64_t uVar2;
  
  uVar1 = stm_now();
  uVar2 = uVar1 - start_ticks;
  if (uVar1 < start_ticks || uVar1 - start_ticks == 0) {
    uVar2 = 1;
  }
  return uVar2;
}

Assistant:

uint64_t sx_tm_since(uint64_t start_ticks)
{
    return stm_since(start_ticks);
}